

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Bool NoMargins(Node *node)

{
  AttVal *pAVar1;
  ctmbstr ptVar2;
  Bool BVar3;
  
  pAVar1 = prvTidyAttrGetById(node,TidyAttr_STYLE);
  BVar3 = no;
  if ((pAVar1 != (AttVal *)0x0) && (pAVar1->value != (ctmbstr)0x0)) {
    ptVar2 = prvTidytmbsubstr(pAVar1->value,"margin-top: 0");
    if (ptVar2 != (ctmbstr)0x0) {
      ptVar2 = prvTidytmbsubstr(pAVar1->value,"margin-bottom: 0");
      BVar3 = (Bool)(ptVar2 != (ctmbstr)0x0);
    }
  }
  return BVar3;
}

Assistant:

static Bool NoMargins(Node *node)
{
    AttVal *attval = TY_(AttrGetById)(node, TidyAttr_STYLE);

    if ( !AttrHasValue(attval) )
        return no;

    /* search for substring "margin-top: 0" */
    if (!TY_(tmbsubstr)(attval->value, "margin-top: 0"))
        return no;

    /* search for substring "margin-bottom: 0" */
    if (!TY_(tmbsubstr)(attval->value, "margin-bottom: 0"))
        return no;

    return yes;
}